

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

HeapType __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::getNew(wasm::HeapType_(void *this,HeapType type)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_28;
  const_iterator iter;
  CodeUpdater *this_local;
  HeapType type_local;
  
  iter.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>)this;
  this_local = (CodeUpdater *)type.id;
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar1) {
    type_local.id = (uintptr_t)this_local;
  }
  else {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::find(*(unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                  **)((long)this + 0x108),(key_type *)&this_local);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::end(*(unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                 **)((long)this + 0x108));
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                           *)&local_28);
      type_local.id = (pvVar2->second).id;
    }
    else {
      type_local.id = (uintptr_t)this_local;
    }
  }
  return (HeapType)type_local.id;
}

Assistant:

HeapType getNew(HeapType type) {
      if (type.isBasic()) {
        return type;
      }
      auto iter = oldToNewTypes.find(type);
      if (iter != oldToNewTypes.end()) {
        return iter->second;
      }
      return type;
    }